

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  stbi__uint16 sVar1;
  uint uVar2;
  stbi__uint16 *psVar3;
  ulong uVar4;
  int iVar5;
  stbi__uint16 *psVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  stbi__uint16 *psVar11;
  int iVar12;
  long in_FS_OFFSET;
  
  psVar3 = (stbi__uint16 *)malloc((ulong)(req_comp * x * 8));
  if (psVar3 == (stbi__uint16 *)0x0) {
    free(data);
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
    psVar3 = (stbi__uint16 *)0x0;
  }
  else {
    if (0 < (int)x) {
      uVar2 = img_n * 8 + 4;
      if ((0x1c < uVar2) || ((0x10101000U >> (uVar2 & 0x1f) & 1) == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                      ,0x737,
                      "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                     );
      }
      uVar4 = 1;
      if (1 < (int)x) {
        uVar4 = (ulong)x;
      }
      iVar5 = req_comp + -1;
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      do {
        if (uVar2 == 0x14) {
          if (-1 < iVar5) {
            lVar10 = 0;
            iVar12 = req_comp;
            do {
              sVar1 = *(stbi__uint16 *)((long)data + lVar10 + (ulong)uVar7 * 2);
              psVar3[(ulong)uVar8 + lVar10 + 2] = sVar1;
              psVar3[(ulong)uVar8 + lVar10 + 1] = sVar1;
              psVar3[(ulong)uVar8 + lVar10] = sVar1;
              psVar3[(ulong)uVar8 + lVar10 + 3] =
                   *(stbi__uint16 *)((long)data + lVar10 + (ulong)uVar7 * 2 + 2);
              iVar12 = iVar12 + -1;
              lVar10 = lVar10 + 4;
            } while (0 < iVar12);
          }
        }
        else if (uVar2 == 0x1c) {
          if (-1 < iVar5) {
            iVar12 = (int)uVar9 * req_comp;
            psVar11 = data + (uint)(iVar12 * img_n);
            psVar6 = psVar3 + (uint)(iVar12 * 4);
            iVar12 = req_comp;
            do {
              *psVar6 = *psVar11;
              psVar6[1] = psVar11[1];
              psVar6[2] = psVar11[2];
              psVar6[3] = 0xffff;
              psVar11 = psVar11 + 3;
              psVar6 = psVar6 + 4;
              iVar12 = iVar12 + -1;
            } while (0 < iVar12);
          }
        }
        else if (-1 < iVar5) {
          lVar10 = 0;
          iVar12 = req_comp;
          do {
            sVar1 = *(stbi__uint16 *)((long)data + lVar10 + (ulong)uVar7 * 2);
            psVar3[(ulong)uVar8 + lVar10 * 2 + 2] = sVar1;
            psVar3[(ulong)uVar8 + lVar10 * 2 + 1] = sVar1;
            psVar3[(ulong)uVar8 + lVar10 * 2] = sVar1;
            psVar3[(ulong)uVar8 + lVar10 * 2 + 3] = 0xffff;
            iVar12 = iVar12 + -1;
            lVar10 = lVar10 + 2;
          } while (0 < iVar12);
        }
        uVar9 = uVar9 + 1;
        uVar8 = uVar8 + req_comp * 4;
        uVar7 = uVar7 + req_comp * img_n;
      } while (uVar9 != uVar4);
    }
    free(data);
  }
  return psVar3;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}